

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O3

double hdr_mean(hdr_histogram *h)

{
  long lVar1;
  long lVar2;
  double dVar3;
  _Bool _Var4;
  int iVar5;
  byte bVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  hdr_iter iter;
  hdr_iter local_a8;
  
  lVar1 = h->total_count;
  local_a8.counts_index = -1;
  local_a8.count = 0;
  local_a8.cumulative_count = 0;
  local_a8.value = 0;
  local_a8.highest_equivalent_value = 0;
  local_a8.value_iterated_from = 0;
  local_a8.value_iterated_to = 0;
  local_a8._next_fp = all_values_iter_next;
  local_a8.h = h;
  local_a8.total_count = lVar1;
  _Var4 = all_values_iter_next(&local_a8);
  dVar3 = 0.0;
  if (0 < lVar1 && _Var4) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      if (local_a8.count != 0) {
        uVar7 = h->sub_bucket_mask | local_a8.value;
        lVar2 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        bVar6 = 0x3f - (((byte)lVar2 ^ 0x3f) + (char)h->sub_bucket_half_count_magnitude);
        iVar5 = (int)(local_a8.value >> (bVar6 & 0x3f));
        lVar9 = lVar9 + local_a8.count;
        lVar8 = lVar8 + (((1L << ((h->sub_bucket_count <= iVar5) + bVar6 & 0x3f)) >> 1) +
                        ((long)iVar5 << (bVar6 & 0x3f))) * local_a8.count;
      }
      _Var4 = (*local_a8._next_fp)(&local_a8);
    } while ((_Var4) && (lVar9 < lVar1));
    dVar3 = (double)lVar8;
  }
  return dVar3 / (double)lVar1;
}

Assistant:

double hdr_mean(const struct hdr_histogram* h)
{
    struct hdr_iter iter;
    int64_t total = 0, count = 0;
    int64_t total_count = h->total_count;

    hdr_iter_init(&iter, h);

    while (hdr_iter_next(&iter) && count < total_count)
    {
        if (0 != iter.count)
        {
            count += iter.count;
            total += iter.count * hdr_median_equivalent_value(h, iter.value);
        }
    }

    return (total * 1.0) / total_count;
}